

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

void __thiscall
OpenMD::RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
          (RectMatrix<double,_6U,_6U> *this,uint beginRow,uint beginCol,SquareMatrix3<double> *m)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  RectMatrix<double,_3U,_3U> *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint j;
  uint i;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar2 = RectMatrix<double,_3U,_3U>::getNRow(in_RCX);
    if (uVar2 <= local_1c) break;
    local_20 = 0;
    while( true ) {
      uVar2 = RectMatrix<double,_3U,_3U>::getNCol(in_RCX);
      if (uVar2 <= local_20) break;
      dVar1 = *(double *)
               (in_RDI + (ulong)(in_ESI + local_1c) * 0x30 + (ulong)(in_EDX + local_20) * 8);
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RCX,local_1c,local_20);
      *pdVar3 = dVar1;
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void getSubMatrix(unsigned int beginRow, unsigned int beginCol,
                      MatrixType& m) {
      assert(beginRow + m.getNRow() - 1 <= getNRow());
      assert(beginCol + m.getNCol() - 1 <= getNCol());

      for (unsigned int i = 0; i < m.getNRow(); ++i)
        for (unsigned int j = 0; j < m.getNCol(); ++j)
          m(i, j) = this->data_[beginRow + i][beginCol + j];
    }